

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  nn_trie_node **self_00;
  nn_trie_node *pnVar9;
  nn_trie_node *pnVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  long *plVar14;
  size_t size_00;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  
  pnVar10 = *self;
  if (size == 0) {
    if (pnVar10 == (nn_trie_node *)0x0) {
      return -0x16;
    }
LAB_00120b46:
    if (pnVar10->refcount == 0) {
      return -0x16;
    }
    uVar8 = pnVar10->refcount - 1;
    pnVar10->refcount = uVar8;
    if (uVar8 != 0) {
      return 0;
    }
    if (pnVar10->type == '\0') {
LAB_00120b71:
      nn_free(pnVar10);
      *self = (nn_trie_node *)0x0;
      return 1;
    }
  }
  else {
    uVar6 = nn_node_check_prefix(pnVar10,data,size);
    uVar13 = (ulong)pnVar10->prefix_len;
    if (uVar6 != pnVar10->prefix_len) {
      return 0;
    }
    if (uVar13 == size) goto LAB_00120b46;
    pbVar16 = data + uVar13;
    self_00 = nn_node_next(pnVar10,*pbVar16);
    if (self_00 == (nn_trie_node **)0x0) {
      return 0;
    }
    iVar7 = nn_node_unsubscribe(self_00,pbVar16 + 1,~uVar13 + size);
    if (iVar7 == 0) {
      return 0;
    }
    if (*self_00 != (nn_trie_node *)0x0) {
      return 1;
    }
    pnVar10 = *self;
    bVar5 = pnVar10->type;
    if (8 < bVar5) {
      uVar3 = (pnVar10->u).dense.nbr;
      if (uVar3 < 10) {
        pnVar9 = (nn_trie_node *)nn_alloc_(0x58);
        pnVar9->refcount = 0;
        pnVar10 = *self;
        bVar5 = pnVar10->prefix_len;
        pnVar9->prefix_len = bVar5;
        memcpy(pnVar9->prefix,pnVar10->prefix,(ulong)bVar5);
        pnVar9->type = '\b';
        uVar13 = 0;
        iVar7 = 0;
        while( true ) {
          pnVar10 = *self;
          bVar5 = (pnVar10->u).sparse.children[0];
          if (uVar13 == ((uint)(pnVar10->u).sparse.children[1] - (uint)bVar5) + 1) break;
          lVar4 = *(long *)(pnVar10[1].prefix + uVar13 * 8 + -6);
          if (lVar4 != 0) {
            pnVar9->prefix[(long)iVar7 + 10] = bVar5 + (char)uVar13;
            *(long *)(pnVar9[1].prefix + (long)iVar7 * 8 + -6) = lVar4;
            iVar7 = iVar7 + 1;
          }
          uVar13 = uVar13 + 1;
        }
        nn_free(pnVar10);
        *self = pnVar9;
        return 1;
      }
      bVar5 = *pbVar16;
      bVar2 = (pnVar10->u).sparse.children[0];
      uVar6 = (uint)bVar2;
      if (bVar5 == bVar2) {
        uVar12 = (uint)(pnVar10->u).sparse.children[1];
        pnVar10 = pnVar10 + 1;
        uVar15 = (uVar12 - uVar6) + 1;
        uVar13 = (ulong)uVar15;
        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
          if (*(long *)(pnVar10->prefix + uVar17 * 8 + -6) != 0) {
            uVar15 = (uint)uVar17;
            uVar13 = uVar17;
            break;
          }
        }
        iVar7 = uVar15 + uVar6;
        memmove(pnVar10,pnVar10->prefix + uVar13 * 8 + -6,(long)(int)((uVar12 - iVar7) + 1) << 3);
        ((*self)->u).sparse.children[0] = (uint8_t)iVar7;
        puVar1 = &((*self)->u).dense.nbr;
        *puVar1 = *puVar1 - 1;
        pnVar10 = *self;
        size_00 = (long)(int)(((uint)(pnVar10->u).sparse.children[1] - iVar7) + 1) * 8 + 0x18;
      }
      else {
        if (bVar5 != (pnVar10->u).sparse.children[1]) {
          (pnVar10->u).dense.nbr = uVar3 - 1;
          return 1;
        }
        plVar14 = (long *)((long)pnVar10 + ((ulong)bVar5 * 8 - (ulong)((uint)bVar2 * 8)) + 0x18);
        for (uVar13 = (ulong)uVar6; bVar5 != uVar13; uVar13 = uVar13 + 1) {
          if (*plVar14 != 0) {
            cVar11 = bVar5 - (char)uVar13;
            goto LAB_00120d50;
          }
          plVar14 = plVar14 + -1;
        }
        cVar11 = '\0';
LAB_00120d50:
        (pnVar10->u).sparse.children[1] = bVar2 + cVar11;
        puVar1 = &((*self)->u).dense.nbr;
        *puVar1 = *puVar1 - 1;
        pnVar10 = *self;
        size_00 = ((ulong)(pnVar10->u).sparse.children[1] - (ulong)(pnVar10->u).sparse.children[0])
                  * 8 + 0x20;
      }
      pnVar10 = (nn_trie_node *)nn_realloc(pnVar10,size_00);
      goto LAB_00120b65;
    }
    uVar13 = (ulong)(uint)bVar5;
    for (uVar17 = 0; uVar6 = (uint)bVar5, uVar13 != uVar17; uVar17 = uVar17 + 1) {
      if (pnVar10->prefix[uVar17 + 10] == *pbVar16) {
        uVar13 = uVar17;
        uVar6 = (uint)uVar17;
        break;
      }
    }
    memmove(pnVar10->prefix + uVar13 + 10,pnVar10->prefix + uVar13 + 0xb,
            (long)(int)((uint)bVar5 + ~uVar6));
    pnVar10 = *self;
    memmove(pnVar10[1].prefix + uVar13 * 8 + -6,pnVar10[1].prefix + uVar13 * 8 + 2,
            ((long)(int)~uVar6 + (ulong)pnVar10->type) * 8);
    pnVar10 = *self;
    bVar5 = pnVar10->type - 1;
    pnVar10->type = bVar5;
    pnVar10 = (nn_trie_node *)nn_realloc(pnVar10,(ulong)bVar5 * 8 + 0x18);
    *self = pnVar10;
    if ((pnVar10->type == '\0') && (pnVar10->refcount == 0)) goto LAB_00120b71;
  }
  pnVar10 = nn_node_compact(pnVar10);
LAB_00120b65:
  *self = pnVar10;
  return 1;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}